

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PortSymbol * __thiscall
slang::BumpAllocator::emplace<slang::ast::PortSymbol,char_const(&)[1],slang::SourceLocation,bool>
          (BumpAllocator *this,char (*args) [1],SourceLocation *args_1,bool *args_2)

{
  string_view name;
  PortSymbol *pPVar1;
  SourceLocation in_RCX;
  size_t in_RDX;
  char *in_RSI;
  char *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  PortSymbol *in_stack_ffffffffffffffd8;
  
  pPVar1 = (PortSymbol *)
           allocate((BumpAllocator *)in_stack_ffffffffffffffd8,
                    CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                    (size_t)in_stack_ffffffffffffffc8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8
            );
  name._M_str = in_RSI;
  name._M_len = in_RDX;
  slang::ast::PortSymbol::PortSymbol
            (in_stack_ffffffffffffffd8,name,in_RCX,(bool)in_stack_ffffffffffffffd7);
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }